

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_list_graph.c
# Opt level: O0

void dfsTraversal_CLG(ClgGraph clgGraph)

{
  long lVar1;
  _Bool *visited;
  int index;
  ClgGraph clgGraph_00;
  undefined8 uStack_40;
  _Bool a_Stack_38 [8];
  _Bool *local_30;
  int local_28;
  int local_24;
  int i_1;
  int i;
  unsigned_long __vla_expr0;
  ClgGraph local_10;
  ClgGraph clgGraph_local;
  
  __vla_expr0 = (unsigned_long)a_Stack_38;
  local_10 = clgGraph;
  if (clgGraph == (ClgGraph)0x0) {
    uStack_40 = 0x110204;
    __assert_fail("clgGraph",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/cross_list_graph.c"
                  ,0x126,"void dfsTraversal_CLG(ClgGraph)");
  }
  _i_1 = (ulong)(uint)clgGraph->vertexSize;
  lVar1 = -(_i_1 + 0xf & 0xfffffffffffffff0);
  local_30 = a_Stack_38 + lVar1;
  for (local_24 = 0; local_24 < clgGraph->vertexSize; local_24 = local_24 + 1) {
    local_30[local_24] = false;
  }
  for (local_28 = 0; clgGraph_00 = local_10, index = local_28, visited = local_30,
      local_28 < local_10->vertexSize; local_28 = local_28 + 1) {
    if ((local_30[local_28] & 1U) == 0) {
      *(undefined8 *)((long)&uStack_40 + lVar1) = 0x11028b;
      dfs_CLG(clgGraph_00,visited,index);
    }
  }
  *(undefined8 *)((long)&uStack_40 + lVar1) = 0x1102ae;
  fprintf(_stdout,anon_var_dwarf_426b + 0x42);
  return;
}

Assistant:

void dfsTraversal_CLG(ClgGraph clgGraph) {
    assert(clgGraph);
    bool visited[clgGraph->vertexSize];

    for (int i = 0; i < clgGraph->vertexSize; ++i)
        visited[i] = false;

    for (int i = 0; i < clgGraph->vertexSize; ++i) {
        if (visited[i]) continue;
        dfs_CLG(clgGraph, visited, i);
    }
    fprintf(stdout, "\n\n");
}